

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamWriter_p.cpp
# Opt level: O3

void __thiscall BamTools::Internal::BamWriterPrivate::~BamWriterPrivate(BamWriterPrivate *this)

{
  pointer pcVar1;
  
  Close(this);
  pcVar1 = (this->m_errorString)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_errorString).field_2) {
    operator_delete(pcVar1);
  }
  BgzfStream::~BgzfStream(&this->m_stream);
  return;
}

Assistant:

BamWriterPrivate::~BamWriterPrivate()
{
    Close();
}